

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::ParsedScene::Sampler(ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  ParameterDictionary parameters;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  ParameterDictionary dict;
  undefined1 in_stack_fffffffffffffe00 [80];
  FileLoc in_stack_fffffffffffffe50;
  ParameterDictionary local_190;
  SceneEntity local_128;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_88;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_88,in_RDX);
  ParameterDictionary::ParameterDictionary(&local_190,&local_88,(this->graphicsState).colorSpace);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_88);
  if (this->currentBlock != WorldBlock) {
    ParameterDictionary::ParameterDictionary
              ((ParameterDictionary *)&stack0xfffffffffffffe08,&local_190);
    parameters.params.ptr = params.ptr;
    parameters.params.alloc =
         (polymorphic_allocator<pbrt::ParsedParameter_*>)
         (polymorphic_allocator<pbrt::ParsedParameter_*>)params.alloc.memoryResource;
    parameters.params.field_2.fixed[0] = params.field_2.fixed[0];
    parameters._24_80_ = in_stack_fffffffffffffe00;
    SceneEntity::SceneEntity(&local_128,name,parameters,in_stack_fffffffffffffe50);
    SceneEntity::operator=(&this->sampler,&local_128);
    SceneEntity::~SceneEntity(&local_128);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                      *)&stack0xfffffffffffffe08);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_190.params);
    return;
  }
  ErrorExit<char_const(&)[8]>
            ((FileLoc *)&params,"Options cannot be set inside world block; \"%s\" is not allowed.",
             (char (*) [8])0x5241c1);
}

Assistant:

void ParsedScene::Sampler(const std::string &name, ParsedParameterVector params,
                          FileLoc loc) {
    ParameterDictionary dict(std::move(params), graphicsState.colorSpace);

    VERIFY_OPTIONS("Sampler");
    sampler = SceneEntity(name, std::move(dict), loc);
}